

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

int uv_tty_reset_mode(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_14;
  int err;
  int saved_errno;
  
  piVar3 = __errno_location();
  iVar2 = termios_spinlock;
  iVar1 = *piVar3;
  LOCK();
  termios_spinlock = 1;
  UNLOCK();
  if (iVar2 == 0) {
    local_14 = 0;
    if (orig_termios_fd != -1) {
      local_14 = uv__tcsetattr(orig_termios_fd,0,&orig_termios);
    }
    LOCK();
    termios_spinlock = 0;
    UNLOCK();
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    err = local_14;
  }
  else {
    err = -0x10;
  }
  return err;
}

Assistant:

int uv_tty_reset_mode(void) {
  int saved_errno;
  int err;

  saved_errno = errno;

  if (atomic_exchange(&termios_spinlock, 1))
    return UV_EBUSY;  /* In uv_tty_set_mode(). */

  err = 0;
  if (orig_termios_fd != -1)
    err = uv__tcsetattr(orig_termios_fd, TCSANOW, &orig_termios);

  atomic_store(&termios_spinlock, 0);
  errno = saved_errno;

  return err;
}